

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_fanout_tree.h
# Opt level: O1

int alex::fanout_tree::find_best_fanout_existing_node<int,int>
              (AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *parent,int bucketID,
              int total_keys,
              vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
              *used_fanout_tree_nodes,int max_fanout)

{
  double dVar1;
  double dVar2;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this;
  pointer pFVar3;
  pointer pFVar4;
  FTNode *pFVar5;
  iterator __position;
  __normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
  __first;
  __normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
  __last;
  bool bVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  undefined4 uVar11;
  undefined7 uVar12;
  undefined1 auVar13 [56];
  vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>> *this_00;
  uint right;
  uint64_t uVar14;
  bool *pbVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  uint left;
  int iVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  FTNode *tree_node;
  ulong uVar25;
  FTNode *__args;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  longdouble lVar39;
  longdouble lVar40;
  longdouble lVar41;
  longdouble lVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  double cost;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> new_level;
  vector<double,_std::allocator<double>_> fanout_costs;
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  fanout_tree;
  LinearModel<int> model;
  DataNodeStats stats;
  int local_1f0;
  int local_1ec;
  double local_1e8;
  double local_1e0;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> local_1c8;
  void *local_1a8;
  iterator iStack_1a0;
  double *local_198;
  double local_188;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  double local_170;
  ulong local_168;
  double local_160;
  undefined1 local_158 [96];
  undefined8 uStack_f8;
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  local_e8;
  LinearModel<int> local_c8;
  vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>> *local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  undefined1 local_98 [16];
  DataNodeStats local_88;
  undefined1 local_78 [64];
  int local_38;
  undefined4 uStack_34;
  
  this = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
         parent->children_[bucketID];
  local_180 = this->num_keys_;
  local_198 = (double *)0x0;
  local_1a8 = (void *)0x0;
  iStack_1a0._M_current = (double *)0x0;
  local_e8.
  super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.
  super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar19 = 1 << ((this->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
  iVar16 = bucketID - bucketID % iVar19;
  dVar1 = (parent->super_AlexNode<int,_int>).model_.a_;
  local_98 = ZEXT816(0);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    auVar26 = vpinsrd_avx(ZEXT416((uint)(iVar19 + iVar16)),iVar16,1);
    auVar26 = vcvtdq2pd_avx(auVar26);
    dVar2 = (parent->super_AlexNode<int,_int>).model_.b_;
    auVar27._8_8_ = dVar2;
    auVar27._0_8_ = dVar2;
    auVar26 = vsubpd_avx512vl(auVar26,auVar27);
    auVar44._8_8_ = dVar1;
    auVar44._0_8_ = dVar1;
    auVar26 = vdivpd_avx(auVar26,auVar44);
    auVar27 = vhsubpd_avx(auVar26,auVar26);
    auVar26 = vshufpd_avx(auVar26,auVar26,1);
    local_98._0_8_ = 1.0 / auVar27._0_8_;
    local_98._8_8_ = 0;
    auVar7._8_8_ = 0x8000000000000000;
    auVar7._0_8_ = 0x8000000000000000;
    auVar27 = vxorpd_avx512vl(local_98,auVar7);
    local_170 = auVar26._0_8_ * auVar27._0_8_;
  }
  else {
    auVar26._8_8_ = 0x8000000000000000;
    auVar26._0_8_ = 0x8000000000000000;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = (double)iVar16 - (parent->super_AlexNode<int,_int>).model_.b_;
    auVar26 = vxorpd_avx512vl(auVar43,auVar26);
    local_170 = auVar26._0_8_ / (double)iVar19;
  }
  local_1d4 = max_fanout;
  local_17c = total_keys;
  local_b8 = (vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>> *)
             used_fanout_tree_nodes;
  if (max_fanout < 1) {
    local_1f0 = 0;
    local_1e0 = 1.79769313486232e+308;
  }
  else {
    local_160 = (double)local_180;
    local_b0 = (double)total_keys;
    uVar25 = 1;
    local_1e0 = 1.79769313486232e+308;
    local_1f0 = 0;
    local_1ec = 0;
    do {
      local_1c8.
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1c8.
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
      _M_impl.super__Vector_impl_data._M_finish = (FTNode *)0x0;
      local_1c8.
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (FTNode *)0x0;
      local_1e8 = 0.0;
      iVar16 = (int)uVar25;
      local_a8 = (double)iVar16;
      local_188 = local_a8 * (double)local_98._0_8_;
      local_a0 = local_a8 * local_170;
      local_1cc = iVar16 + -1;
      iVar16 = iVar16 + (uint)(iVar16 == 0);
      iVar24 = 0;
      uVar17 = 0;
      local_1d0 = iVar16;
      local_168 = uVar25;
      iVar19 = local_1cc;
      do {
        if (iVar24 == iVar19) {
          right = this->data_capacity_;
        }
        else {
          local_158._0_8_ = ((double)(iVar24 + 1) - local_a0) / local_188;
          right = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                  ::lower_bound<double>(this,(double *)local_158);
        }
        auVar13 = local_158._8_56_;
        left = (uint)uVar17;
        if (left == right) {
          local_158._64_10_ = (unkuint10)(uint6)local_158._68_6_ << 0x20;
          local_158._0_8_ = CONCAT44(iVar24,local_1ec);
          local_158._0_64_ = ZEXT2464(CONCAT420(right,CONCAT416(left,CONCAT88(0,local_158._0_8_))));
          if (local_1c8.
              super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_1c8.
              super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
            _M_realloc_insert<alex::fanout_tree::FTNode>
                      (&local_1c8,
                       (iterator)
                       local_1c8.
                       super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(FTNode *)local_158);
          }
          else {
            *(undefined8 *)
             &(local_1c8.
               super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
               ._M_impl.super__Vector_impl_data._M_finish)->num_keys = local_158._64_8_;
            (local_1c8.
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             ._M_impl.super__Vector_impl_data._M_finish)->level = local_158._0_4_;
            (local_1c8.
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             ._M_impl.super__Vector_impl_data._M_finish)->node_id = local_158._4_4_;
            (local_1c8.
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             ._M_impl.super__Vector_impl_data._M_finish)->cost = (double)local_158._8_8_;
            (local_1c8.
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             ._M_impl.super__Vector_impl_data._M_finish)->left_boundary = local_158._16_4_;
            (local_1c8.
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             ._M_impl.super__Vector_impl_data._M_finish)->right_boundary = local_158._20_4_;
            (local_1c8.
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             ._M_impl.super__Vector_impl_data._M_finish)->use = (bool)local_158[0x18];
            *(undefined7 *)
             &(local_1c8.
               super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
               ._M_impl.super__Vector_impl_data._M_finish)->field_0x19 = local_158._25_7_;
            (local_1c8.
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             ._M_impl.super__Vector_impl_data._M_finish)->expected_avg_search_iterations =
                 (double)local_158._32_8_;
            (local_1c8.
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             ._M_impl.super__Vector_impl_data._M_finish)->expected_avg_shifts =
                 (double)local_158._40_8_;
            (local_1c8.
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             ._M_impl.super__Vector_impl_data._M_finish)->a = (double)local_158._48_8_;
            (local_1c8.
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             ._M_impl.super__Vector_impl_data._M_finish)->b = (double)local_158._56_8_;
            local_1c8.
            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_1c8.
                 super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          local_c8.a_ = 0.0;
          local_c8.b_ = 0.0;
          uVar20 = (int)left >> 6;
          uVar14 = (this->bitmap_[(int)uVar20] >> (uVar17 & 0x3f)) << (uVar17 & 0x3f);
          if (uVar14 == 0) {
            uVar22 = (ulong)this->bitmap_size_;
            uVar17 = (long)(int)uVar20 + 1;
            uVar25 = uVar17;
            if ((long)uVar17 < (long)uVar22) {
              do {
                uVar14 = this->bitmap_[uVar17];
                if (uVar14 != 0) {
                  uVar20 = (uint)uVar17;
                  goto LAB_0013a5a8;
                }
                uVar17 = uVar17 + 1;
                uVar25 = uVar22;
              } while (uVar22 != uVar17);
            }
            uVar14 = 0;
            uVar21 = 0xffffffff;
          }
          else {
LAB_0013a5a8:
            uVar21 = 0;
            for (uVar25 = uVar14; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
              uVar21 = uVar21 + 1;
            }
            uVar21 = uVar21 | uVar20 << 6;
            uVar14 = uVar14 - 1 & uVar14;
            uVar25 = (ulong)uVar20;
          }
          local_158._8_4_ = 0;
          local_158._0_8_ = &local_c8;
          auVar28 = local_158._0_64_;
          lVar40 = (longdouble)0;
          local_158._26_38_ = auVar13._18_38_;
          local_158._0_16_ = auVar28._0_16_;
          local_158._16_10_ = lVar40;
          auVar28 = local_158._0_64_;
          local_158._42_22_ = auVar13._34_22_;
          local_158._0_32_ = auVar28._0_32_;
          local_158._32_10_ = lVar40;
          auVar28 = local_158._0_64_;
          local_158._58_6_ = auVar13._50_6_;
          local_158._0_48_ = auVar28._0_48_;
          local_158._48_10_ = lVar40;
          auVar28 = local_158._0_64_;
          local_158._80_4_ = 0x7fffffff;
          local_158._84_4_ = -0x80000000;
          uStack_f8 = 0xffefffffffffffff;
          local_158._88_8_ = 0x7fefffffffffffff;
          iVar16 = 0;
          local_158._64_10_ = lVar40;
          if (uVar21 != 0xffffffff && (int)uVar21 < (int)right) {
            local_158._84_4_ = -0x80000000;
            local_158._80_4_ = 0x7fffffff;
            local_158._8_4_ = 0;
            lVar41 = lVar40;
            lVar42 = lVar40;
            iVar16 = 0;
            iVar19 = local_158._8_4_;
            local_158._0_64_ = auVar28;
            do {
              local_178 = iVar16;
              auVar28 = local_158._0_64_;
              local_174 = this->key_slots_[(int)uVar21];
              iVar19 = iVar19 + 1;
              local_158._8_4_ = iVar19;
              auVar29 = local_158._0_64_;
              lVar39 = (longdouble)local_174;
              lVar40 = lVar40 + lVar39;
              lVar41 = lVar41 + (longdouble)local_178;
              lVar42 = lVar39 * lVar39 + lVar42;
              local_158._64_10_ = (longdouble)local_178 * lVar39 + (longdouble)local_158._64_10_;
              if (local_174 <= (int)local_158._80_4_) {
                local_158._80_4_ = local_174;
              }
              iVar16 = local_174;
              if (local_174 < (int)local_158._84_4_) {
                iVar16 = local_158._84_4_;
              }
              local_158._84_4_ = iVar16;
              if (uVar14 == 0) {
                uVar22 = (ulong)this->bitmap_size_;
                lVar23 = (long)(int)uVar25;
                uVar17 = lVar23 + 1U;
                if ((long)(lVar23 + 1U) < (long)uVar22) {
                  lVar18 = 1;
                  do {
                    uVar14 = this->bitmap_[lVar23 + lVar18];
                    if (uVar14 != 0) {
                      uVar25 = (ulong)(uint)((int)uVar25 + (int)lVar18);
                      goto LAB_0013a721;
                    }
                    lVar18 = lVar18 + 1;
                    uVar17 = uVar22;
                  } while (uVar22 - lVar23 != lVar18);
                }
                uVar21 = 0xffffffff;
                uVar25 = uVar17 & 0xffffffff;
              }
              else {
LAB_0013a721:
                uVar21 = 0;
                for (uVar17 = uVar14; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000)
                {
                  uVar21 = uVar21 + 1;
                }
                uVar21 = uVar21 | (int)uVar25 << 6;
                uVar14 = uVar14 - 1 & uVar14;
              }
              auVar46._0_8_ = (double)local_178;
              auVar46._8_8_ = auVar46._0_8_;
              auVar26 = vunpcklpd_avx(unique0x10000760,auVar46);
              lVar23 = local_158._96_8_;
              auVar48._8_8_ = lVar23;
              auVar48._0_8_ = auVar46._0_8_;
              uVar17 = vcmppd_avx512vl(auVar26,auVar48,1);
              bVar6 = (bool)((byte)(uVar17 & 3) & 1);
              local_158._88_8_ =
                   (ulong)bVar6 * local_158._88_8_ | (ulong)!bVar6 * (long)auVar46._0_8_;
              uVar17 = (uVar17 & 3) >> 1;
              uStack_f8 = uVar17 * lVar23 | (ulong)!SUB81(uVar17,0) * (long)auVar46._0_8_;
              iVar16 = local_178 + 1;
            } while (((int)uVar21 < (int)right) && (uVar21 != 0xffffffff));
            local_158._26_38_ = auVar28._26_38_;
            local_158._0_16_ = auVar29._0_16_;
            local_158._16_10_ = lVar40;
            auVar29 = local_158._0_64_;
            local_158._42_22_ = auVar28._42_22_;
            local_158._0_32_ = auVar29._0_32_;
            local_158._32_10_ = lVar41;
            auVar29 = local_158._0_64_;
            local_158._58_6_ = auVar28._58_6_;
            local_158._0_48_ = auVar29._0_48_;
            local_158._48_10_ = lVar42;
          }
          LinearModelBuilder<int>::build((LinearModelBuilder<int> *)local_158);
          iVar19 = this->num_lookups_ + this->num_inserts_;
          local_88.num_search_iterations = 0.0;
          local_88.num_shifts = 0.0;
          local_78._8_8_ =
               AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
               ::compute_expected_cost_from_existing
                         (this,left,right,0.7,
                          (double)((ulong)(iVar19 != 0) *
                                  (long)((double)this->num_inserts_ / (double)iVar19)),&local_c8,
                          &local_88);
          local_1e8 = ((double)local_78._8_8_ * (double)iVar16) / local_160 + local_1e8;
          local_78._0_4_ = local_1ec;
          local_78[0x18] = false;
          local_78._56_8_ = local_c8.b_;
          local_78._48_8_ = local_c8.a_;
          local_78._32_8_ = local_88.num_search_iterations;
          local_78._40_8_ = local_88.num_shifts;
          local_78._4_4_ = iVar24;
          local_78._16_4_ = left;
          local_78._20_4_ = right;
          local_38 = iVar16;
          if (local_1c8.
              super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_1c8.
              super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::
            _M_realloc_insert<alex::fanout_tree::FTNode>
                      (&local_1c8,
                       (iterator)
                       local_1c8.
                       super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(FTNode *)local_78);
            iVar16 = local_1d0;
            iVar19 = local_1cc;
          }
          else {
            *(ulong *)&(local_1c8.
                        super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->num_keys =
                 CONCAT44(uStack_34,iVar16);
            (local_1c8.
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             ._M_impl.super__Vector_impl_data._M_finish)->level = local_1ec;
            (local_1c8.
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             ._M_impl.super__Vector_impl_data._M_finish)->node_id = iVar24;
            (local_1c8.
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             ._M_impl.super__Vector_impl_data._M_finish)->cost = (double)local_78._8_8_;
            (local_1c8.
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             ._M_impl.super__Vector_impl_data._M_finish)->left_boundary = left;
            (local_1c8.
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             ._M_impl.super__Vector_impl_data._M_finish)->right_boundary = right;
            (local_1c8.
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             ._M_impl.super__Vector_impl_data._M_finish)->use = false;
            *(undefined7 *)
             &(local_1c8.
               super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
               ._M_impl.super__Vector_impl_data._M_finish)->field_0x19 = local_78._25_7_;
            (local_1c8.
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             ._M_impl.super__Vector_impl_data._M_finish)->expected_avg_search_iterations =
                 local_88.num_search_iterations;
            (local_1c8.
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             ._M_impl.super__Vector_impl_data._M_finish)->expected_avg_shifts = local_88.num_shifts;
            (local_1c8.
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             ._M_impl.super__Vector_impl_data._M_finish)->a = local_c8.a_;
            (local_1c8.
             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
             ._M_impl.super__Vector_impl_data._M_finish)->b = local_c8.b_;
            local_1c8.
            super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_1c8.
                 super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            iVar16 = local_1d0;
            iVar19 = local_1cc;
          }
        }
        iVar24 = iVar24 + 1;
        uVar17 = (ulong)right;
      } while (iVar24 != iVar16);
      local_1e8 = (local_a8 * 5e-07 * 208.0 * local_b0) / local_160 + 20.0 + local_1e8;
      if (iStack_1a0._M_current == local_198) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_1a8,iStack_1a0,&local_1e8);
        iVar16 = (int)local_168;
      }
      else {
        *iStack_1a0._M_current = local_1e8;
        iStack_1a0._M_current = iStack_1a0._M_current + 1;
        iVar16 = (int)local_168;
      }
      uVar25 = (long)iStack_1a0._M_current - (long)local_1a8;
      if (((uVar25 < 0x11) ||
          (dVar1 = *(double *)((long)local_1a8 + (uVar25 - 0x10)),
          *(double *)((long)local_1a8 + (uVar25 - 8)) <= dVar1)) ||
         (dVar1 <= *(double *)((long)local_1a8 + (uVar25 - 0x18)))) {
        local_188 = local_1e8;
        if (local_1e8 < local_1e0) {
          local_1f0 = local_1ec;
        }
        std::
        vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
        ::push_back(&local_e8,&local_1c8);
        auVar45._8_8_ = 0;
        auVar45._0_8_ = local_1e0;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = local_188;
        auVar26 = vminsd_avx(auVar47,auVar45);
        local_1e0 = auVar26._0_8_;
        bVar6 = true;
      }
      else {
        bVar6 = false;
      }
      if (local_1c8.
          super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1c8.
                        super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1c8.
                              super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1c8.
                              super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (!bVar6) break;
      uVar25 = (ulong)(uint)(iVar16 * 2);
      local_1ec = local_1ec + 1;
    } while (iVar16 * 2 <= local_1d4);
  }
  this_00 = local_b8;
  pFVar3 = local_e8.
           super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[local_1f0].
           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar4 = local_e8.
           super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[local_1f0].
           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar3 != pFVar4) {
    auVar28 = vpbroadcastq_avx512f();
    auVar28 = vpsrlq_avx512f(auVar28,6);
    pbVar15 = &pFVar3[0x3f].use;
    uVar25 = 0;
    auVar29 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
    auVar34 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
    auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar37 = vpbroadcastq_avx512f();
      auVar38 = vporq_avx512f(auVar37,auVar36);
      uVar17 = vpcmpuq_avx512f(auVar38,auVar28,2);
      if ((uVar17 & 1) != 0) {
        pbVar15[-0x11b8] = true;
      }
      if ((uVar17 & 2) != 0) {
        pbVar15[-0x1170] = true;
      }
      if ((uVar17 & 4) != 0) {
        pbVar15[-0x1128] = true;
      }
      if ((uVar17 & 8) != 0) {
        pbVar15[-0x10e0] = true;
      }
      if ((uVar17 & 0x10) != 0) {
        pbVar15[-0x1098] = true;
      }
      if ((uVar17 & 0x20) != 0) {
        pbVar15[-0x1050] = true;
      }
      if ((uVar17 & 0x40) != 0) {
        pbVar15[-0x1008] = true;
      }
      if ((uVar17 & 0x80) != 0) {
        pbVar15[-0xfc0] = true;
      }
      auVar38 = vporq_avx512f(auVar37,auVar35);
      uVar17 = vpcmpuq_avx512f(auVar38,auVar28,2);
      if ((uVar17 & 1) != 0) {
        pbVar15[-0xf78] = true;
      }
      if ((uVar17 & 2) != 0) {
        pbVar15[-0xf30] = true;
      }
      if ((uVar17 & 4) != 0) {
        pbVar15[-0xee8] = true;
      }
      if ((uVar17 & 8) != 0) {
        pbVar15[-0xea0] = true;
      }
      if ((uVar17 & 0x10) != 0) {
        pbVar15[-0xe58] = true;
      }
      if ((uVar17 & 0x20) != 0) {
        pbVar15[-0xe10] = true;
      }
      if ((uVar17 & 0x40) != 0) {
        pbVar15[-0xdc8] = true;
      }
      if ((uVar17 & 0x80) != 0) {
        pbVar15[-0xd80] = true;
      }
      auVar38 = vporq_avx512f(auVar37,auVar34);
      uVar17 = vpcmpuq_avx512f(auVar38,auVar28,2);
      if ((uVar17 & 1) != 0) {
        pbVar15[-0xd38] = true;
      }
      if ((uVar17 & 2) != 0) {
        pbVar15[-0xcf0] = true;
      }
      if ((uVar17 & 4) != 0) {
        pbVar15[-0xca8] = true;
      }
      if ((uVar17 & 8) != 0) {
        pbVar15[-0xc60] = true;
      }
      if ((uVar17 & 0x10) != 0) {
        pbVar15[-0xc18] = true;
      }
      if ((uVar17 & 0x20) != 0) {
        pbVar15[-0xbd0] = true;
      }
      if ((uVar17 & 0x40) != 0) {
        pbVar15[-0xb88] = true;
      }
      if ((uVar17 & 0x80) != 0) {
        pbVar15[-0xb40] = true;
      }
      auVar38 = vporq_avx512f(auVar37,auVar33);
      uVar17 = vpcmpuq_avx512f(auVar38,auVar28,2);
      if ((uVar17 & 1) != 0) {
        pbVar15[-0xaf8] = true;
      }
      if ((uVar17 & 2) != 0) {
        pbVar15[-0xab0] = true;
      }
      if ((uVar17 & 4) != 0) {
        pbVar15[-0xa68] = true;
      }
      if ((uVar17 & 8) != 0) {
        pbVar15[-0xa20] = true;
      }
      if ((uVar17 & 0x10) != 0) {
        pbVar15[-0x9d8] = true;
      }
      if ((uVar17 & 0x20) != 0) {
        pbVar15[-0x990] = true;
      }
      if ((uVar17 & 0x40) != 0) {
        pbVar15[-0x948] = true;
      }
      if ((uVar17 & 0x80) != 0) {
        pbVar15[-0x900] = true;
      }
      auVar38 = vporq_avx512f(auVar37,auVar32);
      uVar17 = vpcmpuq_avx512f(auVar38,auVar28,2);
      if ((uVar17 & 1) != 0) {
        pbVar15[-0x8b8] = true;
      }
      if ((uVar17 & 2) != 0) {
        pbVar15[-0x870] = true;
      }
      if ((uVar17 & 4) != 0) {
        pbVar15[-0x828] = true;
      }
      if ((uVar17 & 8) != 0) {
        pbVar15[-0x7e0] = true;
      }
      if ((uVar17 & 0x10) != 0) {
        pbVar15[-0x798] = true;
      }
      if ((uVar17 & 0x20) != 0) {
        pbVar15[-0x750] = true;
      }
      if ((uVar17 & 0x40) != 0) {
        pbVar15[-0x708] = true;
      }
      if ((uVar17 & 0x80) != 0) {
        pbVar15[-0x6c0] = true;
      }
      auVar38 = vporq_avx512f(auVar37,auVar31);
      uVar17 = vpcmpuq_avx512f(auVar38,auVar28,2);
      if ((uVar17 & 1) != 0) {
        pbVar15[-0x678] = true;
      }
      if ((uVar17 & 2) != 0) {
        pbVar15[-0x630] = true;
      }
      if ((uVar17 & 4) != 0) {
        pbVar15[-0x5e8] = true;
      }
      if ((uVar17 & 8) != 0) {
        pbVar15[-0x5a0] = true;
      }
      if ((uVar17 & 0x10) != 0) {
        pbVar15[-0x558] = true;
      }
      if ((uVar17 & 0x20) != 0) {
        pbVar15[-0x510] = true;
      }
      if ((uVar17 & 0x40) != 0) {
        pbVar15[-0x4c8] = true;
      }
      if ((uVar17 & 0x80) != 0) {
        pbVar15[-0x480] = true;
      }
      auVar38 = vporq_avx512f(auVar37,auVar30);
      uVar17 = vpcmpuq_avx512f(auVar38,auVar28,2);
      if ((uVar17 & 1) != 0) {
        pbVar15[-0x438] = true;
      }
      if ((uVar17 & 2) != 0) {
        pbVar15[-0x3f0] = true;
      }
      if ((uVar17 & 4) != 0) {
        pbVar15[-0x3a8] = true;
      }
      if ((uVar17 & 8) != 0) {
        pbVar15[-0x360] = true;
      }
      if ((uVar17 & 0x10) != 0) {
        pbVar15[-0x318] = true;
      }
      if ((uVar17 & 0x20) != 0) {
        pbVar15[-0x2d0] = true;
      }
      if ((uVar17 & 0x40) != 0) {
        pbVar15[-0x288] = true;
      }
      if ((uVar17 & 0x80) != 0) {
        pbVar15[-0x240] = true;
      }
      auVar37 = vporq_avx512f(auVar37,auVar29);
      uVar17 = vpcmpuq_avx512f(auVar37,auVar28,2);
      if ((uVar17 & 1) != 0) {
        pbVar15[-0x1f8] = true;
      }
      if ((uVar17 & 2) != 0) {
        pbVar15[-0x1b0] = true;
      }
      if ((uVar17 & 4) != 0) {
        pbVar15[-0x168] = true;
      }
      if ((uVar17 & 8) != 0) {
        pbVar15[-0x120] = true;
      }
      if ((uVar17 & 0x10) != 0) {
        pbVar15[-0xd8] = true;
      }
      if ((uVar17 & 0x20) != 0) {
        pbVar15[-0x90] = true;
      }
      if ((uVar17 & 0x40) != 0) {
        pbVar15[-0x48] = true;
      }
      if ((uVar17 & 0x80) != 0) {
        *pbVar15 = true;
      }
      uVar25 = uVar25 + 0x40;
      pbVar15 = pbVar15 + 0x1200;
    } while (((ulong)((long)pFVar4 + (-0x48 - (long)pFVar3)) / 0x48 + 0x40 & 0xffffffffffffffc0) !=
             uVar25);
  }
  merge_nodes_upwards<int,int>(local_1f0,local_1e0,local_180,local_17c,&local_e8);
  iVar16 = (int)((ulong)((long)local_e8.
                               super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_e8.
                              super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 + -1;
  if (local_1f0 <= iVar16) {
    iVar16 = local_1f0;
  }
  local_158._0_4_ = iVar16;
  if (-1 < iVar16) {
    lVar23 = 0;
    do {
      pFVar5 = local_e8.
               super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar23].
               super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__args = local_e8.
                    super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar23].
                    super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start; __args != pFVar5; __args = __args + 1
          ) {
        if (__args->use == true) {
          __position._M_current = *(FTNode **)(this_00 + 8);
          if (__position._M_current == *(FTNode **)(this_00 + 0x10)) {
            std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>::
            _M_realloc_insert<alex::fanout_tree::FTNode_const&>(this_00,__position,__args);
          }
          else {
            uVar11 = *(undefined4 *)&__args->field_0x44;
            (__position._M_current)->num_keys = __args->num_keys;
            *(undefined4 *)&(__position._M_current)->field_0x44 = uVar11;
            iVar16 = __args->node_id;
            dVar1 = __args->cost;
            iVar19 = __args->left_boundary;
            iVar24 = __args->right_boundary;
            bVar6 = __args->use;
            uVar12 = *(undefined7 *)&__args->field_0x19;
            dVar2 = __args->expected_avg_search_iterations;
            dVar8 = __args->expected_avg_shifts;
            dVar9 = __args->a;
            dVar10 = __args->b;
            (__position._M_current)->level = __args->level;
            (__position._M_current)->node_id = iVar16;
            (__position._M_current)->cost = dVar1;
            (__position._M_current)->left_boundary = iVar19;
            (__position._M_current)->right_boundary = iVar24;
            (__position._M_current)->use = bVar6;
            *(undefined7 *)&(__position._M_current)->field_0x19 = uVar12;
            (__position._M_current)->expected_avg_search_iterations = dVar2;
            (__position._M_current)->expected_avg_shifts = dVar8;
            (__position._M_current)->a = dVar9;
            (__position._M_current)->b = dVar10;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x48;
          }
        }
      }
      bVar6 = lVar23 < (int)local_158._0_4_;
      lVar23 = lVar23 + 1;
    } while (bVar6);
  }
  __first._M_current = *(FTNode **)this_00;
  __last._M_current = *(FTNode **)(this_00 + 8);
  if (__first._M_current != __last._M_current) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<alex::fanout_tree::FTNode*,std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<alex::fanout_tree::collect_used_nodes(std::vector<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>,std::allocator<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>>const&,int,std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>&)::_lambda(alex::fanout_tree::FTNode&,alex::fanout_tree::FTNode&)_1_>>
              (__first,__last,
               (ulong)(uint)((int)LZCOUNT(((long)__last._M_current - (long)__first._M_current >> 3)
                                          * -0x71c71c71c71c71c7) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]ALEX_src_core_alex_fanout_tree_h:51:13)>
                )local_158);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<alex::fanout_tree::FTNode*,std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>,__gnu_cxx::__ops::_Iter_comp_iter<alex::fanout_tree::collect_used_nodes(std::vector<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>,std::allocator<std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>>>const&,int,std::vector<alex::fanout_tree::FTNode,std::allocator<alex::fanout_tree::FTNode>>&)::_lambda(alex::fanout_tree::FTNode&,alex::fanout_tree::FTNode&)_1_>>
              (__first,__last,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_microsoft[P]ALEX_src_core_alex_fanout_tree_h:51:13)>
                )local_158);
  }
  std::
  vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
  ::~vector(&local_e8);
  if (local_1a8 != (void *)0x0) {
    operator_delete(local_1a8,(long)local_198 - (long)local_1a8);
  }
  return local_1f0;
}

Assistant:

int find_best_fanout_existing_node(const AlexModelNode<T, P>* parent,
                                   int bucketID, int total_keys,
                                   std::vector<FTNode>& used_fanout_tree_nodes,
                                   int max_fanout) {
  // Repeatedly add levels to the fanout tree until the overall cost of each
  // level starts to increase
  auto node = static_cast<AlexDataNode<T, P>*>(parent->children_[bucketID]);
  int num_keys = node->num_keys_;
  int best_level = 0;
  double best_cost = std::numeric_limits<double>::max();
  std::vector<double> fanout_costs;
  std::vector<std::vector<FTNode>> fanout_tree;

  int repeats = 1 << node->duplication_factor_;
  int start_bucketID =
      bucketID - (bucketID % repeats);  // first bucket with same child
  int end_bucketID =
      start_bucketID + repeats;  // first bucket with different child
  LinearModel<T> base_model;
  if (parent->model_.a_ == 0){
    base_model.a_ = 0;
    base_model.b_ = -1.0 * (start_bucketID - parent->model_.b_) / repeats;
  }
  else{
    double left_boundary_value =
      (start_bucketID - parent->model_.b_) / parent->model_.a_;
    double right_boundary_value =
        (end_bucketID - parent->model_.b_) / parent->model_.a_;
    base_model.a_ = 1.0 / (right_boundary_value - left_boundary_value);
    base_model.b_ = -1.0 * base_model.a_ * left_boundary_value;
  }

  for (int fanout = 1, fanout_tree_level = 0; fanout <= max_fanout;
       fanout *= 2, fanout_tree_level++) {
    std::vector<FTNode> new_level;
    double cost = 0.0;
    double a = base_model.a_ * fanout;
    double b = base_model.b_ * fanout;
    int left_boundary = 0;
    int right_boundary = 0;
    for (int i = 0; i < fanout; i++) {
      left_boundary = right_boundary;
      right_boundary = i == fanout - 1 ? node->data_capacity_
                                       : node->lower_bound(((i + 1) - b) / a);
      if (left_boundary == right_boundary) {
        new_level.push_back({fanout_tree_level, i, 0, left_boundary,
                             right_boundary, false, 0, 0, 0, 0, 0});
        continue;
      }
      int num_actual_keys = 0;
      LinearModel<T> model;
      typename AlexDataNode<T, P>::const_iterator_type it(node, left_boundary);
      LinearModelBuilder<T> builder(&model);
      for (int j = 0; it.cur_idx_ < right_boundary && !it.is_end(); it++, j++) {
        builder.add(it.key(), j);
        num_actual_keys++;
      }
      builder.build();

      double empirical_insert_frac = node->frac_inserts();
      DataNodeStats stats;
      double node_cost =
          AlexDataNode<T, P>::compute_expected_cost_from_existing(
              node, left_boundary, right_boundary,
              AlexDataNode<T, P>::kInitDensity_, empirical_insert_frac, &model,
              &stats);

      cost += node_cost * num_actual_keys / num_keys;

      new_level.push_back({fanout_tree_level, i, node_cost, left_boundary,
                           right_boundary, false, stats.num_search_iterations,
                           stats.num_shifts, model.a_, model.b_,
                           num_actual_keys});
    }
    // model weight reflects that it has global effect, not local effect
    double traversal_cost =
        kNodeLookupsWeight +
        (kModelSizeWeight * fanout *
         (sizeof(AlexDataNode<T, P>) + sizeof(void*)) * total_keys / num_keys);
    cost += traversal_cost;
    fanout_costs.push_back(cost);
    // stop after expanding fanout increases cost twice in a row
    if (fanout_costs.size() >= 3 &&
        fanout_costs[fanout_costs.size() - 1] >
            fanout_costs[fanout_costs.size() - 2] &&
        fanout_costs[fanout_costs.size() - 2] >
            fanout_costs[fanout_costs.size() - 3]) {
      break;
    }
    if (cost < best_cost) {
      best_cost = cost;
      best_level = fanout_tree_level;
    }
    fanout_tree.push_back(new_level);
  }
  for (FTNode& tree_node : fanout_tree[best_level]) {
    tree_node.use = true;
  }

  // Merge nodes to improve cost
  merge_nodes_upwards<T, P>(best_level, best_cost, num_keys, total_keys,
                            fanout_tree);

  collect_used_nodes(fanout_tree, best_level, used_fanout_tree_nodes);
  return best_level;
}